

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_delta_q_params(AV1_COMMON *cm,MACROBLOCKD *xd,int skip,aom_writer *w)

{
  uint8_t uVar1;
  MB_MODE_INFO *pMVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  aom_writer *in_R9;
  ulong uVar7;
  bool bVar8;
  
  if ((cm->delta_q_info).delta_q_present_flag != 0) {
    pMVar2 = *xd->mi;
    uVar5 = cm->seq_params->mib_size - 1;
    if ((xd->mi_row & uVar5) == 0) {
      bVar8 = (xd->mi_col & uVar5) == 0;
    }
    else {
      bVar8 = false;
    }
    if ((skip == 0 || pMVar2->bsize != cm->seq_params->sb_size) && (bVar8)) {
      uVar4 = (pMVar2->current_qindex - xd->current_base_qindex) / (cm->delta_q_info).delta_q_res;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      uVar6 = 3;
      if (uVar5 < 3) {
        uVar6 = uVar5;
      }
      aom_write_symbol(w,uVar6,xd->tile_ctx->delta_q_cdf,4);
      if (2 < uVar5) {
        uVar6 = 0x1f;
        if (uVar5 - 1 != 0) {
          for (; uVar5 - 1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        bVar3 = (byte)uVar6 & 0x1f;
        aom_write_literal(w,(uVar6 ^ 0xffffffe0) + 0x1f,3);
        aom_write_literal(w,(-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3) + uVar5,uVar6);
      }
      if (uVar4 != 0) {
        aom_write_bit(w,uVar4 >> 0x1f);
      }
      xd->current_base_qindex = pMVar2->current_qindex;
      if ((cm->delta_q_info).delta_lf_present_flag != 0) {
        if ((cm->delta_q_info).delta_lf_multi == 0) {
          write_delta_lflevel((AV1_COMMON *)xd,(MACROBLOCKD *)0xffffffffffffffff,
                              ((int)pMVar2->delta_lf_from_base - (int)xd->delta_lf_from_base) /
                              (cm->delta_q_info).delta_lf_res,0,(int)w,in_R9);
          xd->delta_lf_from_base = pMVar2->delta_lf_from_base;
        }
        else {
          uVar1 = cm->seq_params->monochrome;
          for (uVar7 = 0; (ulong)(uVar1 == '\0') * 2 + 2 != uVar7; uVar7 = uVar7 + 1) {
            write_delta_lflevel((AV1_COMMON *)xd,(MACROBLOCKD *)(uVar7 & 0xffffffff),
                                ((int)pMVar2->delta_lf[uVar7] - (int)xd->delta_lf[uVar7]) /
                                (cm->delta_q_info).delta_lf_res,1,(int)w,in_R9);
            xd->delta_lf[uVar7] = pMVar2->delta_lf[uVar7];
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void write_delta_q_params(AV1_COMMON *const cm,
                                        MACROBLOCKD *const xd, int skip,
                                        aom_writer *w) {
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;

  if (delta_q_info->delta_q_present_flag) {
    const MB_MODE_INFO *const mbmi = xd->mi[0];
    const BLOCK_SIZE bsize = mbmi->bsize;
    const int super_block_upper_left =
        ((xd->mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
        ((xd->mi_col & (cm->seq_params->mib_size - 1)) == 0);

    if ((bsize != cm->seq_params->sb_size || skip == 0) &&
        super_block_upper_left) {
      assert(mbmi->current_qindex > 0);
      const int reduced_delta_qindex =
          (mbmi->current_qindex - xd->current_base_qindex) /
          delta_q_info->delta_q_res;
      write_delta_qindex(xd, reduced_delta_qindex, w);
      xd->current_base_qindex = mbmi->current_qindex;
      if (delta_q_info->delta_lf_present_flag) {
        if (delta_q_info->delta_lf_multi) {
          const int frame_lf_count =
              av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
          for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
            int reduced_delta_lflevel =
                (mbmi->delta_lf[lf_id] - xd->delta_lf[lf_id]) /
                delta_q_info->delta_lf_res;
            write_delta_lflevel(cm, xd, lf_id, reduced_delta_lflevel, 1, w);
            xd->delta_lf[lf_id] = mbmi->delta_lf[lf_id];
          }
        } else {
          int reduced_delta_lflevel =
              (mbmi->delta_lf_from_base - xd->delta_lf_from_base) /
              delta_q_info->delta_lf_res;
          write_delta_lflevel(cm, xd, -1, reduced_delta_lflevel, 0, w);
          xd->delta_lf_from_base = mbmi->delta_lf_from_base;
        }
      }
    }
  }
}